

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O0

int __thiscall Confparse::Load(Confparse *this,path *filepath,bool save_default)

{
  byte bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  size_type sVar4;
  void *pvVar5;
  streamoff sVar6;
  long lVar7;
  ostream *poVar8;
  byte in_DL;
  Confparse *in_RSI;
  path *in_RDI;
  streampos sz;
  ofstream file_1;
  ifstream file;
  undefined8 in_stack_fffffffffffffb10;
  openmode __mode;
  path *in_stack_fffffffffffffb18;
  basic_ofstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb20;
  undefined1 local_448 [16];
  undefined1 local_438 [360];
  path *in_stack_fffffffffffffd30;
  Confparse *in_stack_fffffffffffffd38;
  char local_228 [519];
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  int local_4;
  
  bVar1 = in_DL & 1;
  std::ifstream::ifstream(local_228);
  _Var3 = std::operator|(_S_in,_S_bin);
  std::operator|(_Var3,_S_ate);
  __mode = (openmode)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18,__mode);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    in_RDI[0x101]._M_pathname.field_2._M_allocated_capacity = 0;
    *(undefined8 *)&in_RDI[0x101]._M_pathname = 0;
    if ((in_RDI[0x101]._M_pathname.field_2._M_local_buf[8] & 1U) == 0) {
      if ((bVar1 & 1) == 0) {
        std::ofstream::ofstream(local_438);
        _Var3 = std::operator|(_S_out,_S_bin);
        std::operator|(_Var3,_S_ate);
        std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                  (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,__mode);
        in_RDI[0x101]._M_pathname.field_2._M_local_buf[8] = '\x01';
        std::ofstream::close();
        local_4 = Load(in_RSI,(path *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                       (bool)in_stack_ffffffffffffffdf);
        std::ofstream::~ofstream(local_438);
      }
      else {
        local_4 = SaveDefault(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    std::filesystem::__cxx11::path::operator=(in_RDI,&in_RSI->filepath);
    if (*(long *)&in_RDI[0x101]._M_pathname != 0) {
      free(*(void **)&in_RDI[0x101]._M_pathname);
    }
    local_448 = std::istream::tellg();
    sVar4 = std::fpos::operator_cast_to_long((fpos *)local_448);
    in_RDI[0x101]._M_pathname.field_2._M_allocated_capacity = sVar4;
    pvVar5 = calloc(1,in_RDI[0x101]._M_pathname.field_2._M_allocated_capacity + 1);
    *(void **)&in_RDI[0x101]._M_pathname = pvVar5;
    std::istream::seekg((long)local_228,_S_beg);
    lVar7 = *(long *)&in_RDI[0x101]._M_pathname;
    std::fpos::operator_cast_to_long((fpos *)local_448);
    std::istream::read(local_228,lVar7);
    lVar7 = *(long *)&in_RDI[0x101]._M_pathname;
    sVar6 = std::fpos::operator_cast_to_long((fpos *)local_448);
    in_RDI[0x101]._M_pathname._M_string_length = lVar7 + sVar6;
    std::ifstream::close();
    lVar7 = std::istream::gcount();
    sVar6 = std::fpos::operator_cast_to_long((fpos *)local_448);
    if (lVar7 == sVar6) {
      in_RDI[0x101]._M_pathname.field_2._M_local_buf[8] = '\0';
      local_4 = 0;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "Did not read the right number of bytes from configuration file ");
      lVar7 = std::istream::gcount();
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar7);
      poVar8 = std::operator<<(poVar8," != ");
      sVar6 = std::fpos::operator_cast_to_long((fpos *)local_448);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar6);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
    }
  }
  std::ifstream::~ifstream(local_228);
  return local_4;
}

Assistant:

int Confparse::Load(const filesystem::path &filepath, bool save_default) {
	ifstream file;
	file.open(filepath, std::ios::in | std::ios::binary | std::ios::ate);
	if (!file.is_open()) {
		//		std::cerr << "Error opening " << filepath.string() << ": " <<
		// strerror(errno) << std::endl;
		buffer_size = 0;
		conf        = NULL;
		if (nested) return 1; // to prevent infinite recursion, we test the nested flag
		if (save_default) { // Create file with default OBV configuration
			return (SaveDefault(filepath));
		} else { // Create empty file
			ofstream file;
			file.open(filepath, std::ios::out | std::ios::binary | std::ios::ate);
			nested = true;
			file.close();
			return Load(filepath);
		}
	}

	this->filepath = filepath;

	if (conf) free(conf);

	std::streampos sz = file.tellg();
	buffer_size       = sz;
	conf              = (char *)calloc(1, buffer_size + 1);
	file.seekg(0, std::ios::beg);
	file.read(conf, sz);
	limit = conf + sz;
	file.close();

	if (file.gcount() != sz) {
		std::cerr << "Did not read the right number of bytes from configuration file " << file.gcount() << " != " << sz << std::endl;
		return 1;
	}
	//	assert(file.gcount() == sz);
	//
	//

	nested = false;

	return 0;
}